

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O0

RawAccessChain
dxil_spv::emit_raw_access_chain
          (Impl *impl,ResourceMeta *meta,CallInst *inst,Type *element_type,uint vecsize)

{
  RawAccessChain RVar1;
  bool bVar2;
  TypeID TVar3;
  Id IVar4;
  int iVar5;
  uint uVar6;
  Id arg;
  Builder *this;
  Operation *this_00;
  Value *pVVar7;
  Value *pVVar8;
  Id local_70;
  Id element_id;
  uint addr_shift_log2;
  uint scalar_size;
  Operation *op;
  Id ptr_vec_type;
  Id vec_type;
  Id raw_component_type_id;
  Builder *builder;
  uint vecsize_local;
  Type *element_type_local;
  CallInst *inst_local;
  ResourceMeta *meta_local;
  Impl *impl_local;
  RawAccessChain raw;
  
  this = Converter::Impl::builder(impl);
  memset(&impl_local,0,0x10);
  if (((((impl->execution_mode_meta).native_16bit_operations & 1U) == 0) &&
      (((impl->options).min_precision_prefer_native_16bit & 1U) != 0)) &&
     (bVar2 = type_is_16bit(element_type), bVar2)) {
    TVar3 = LLVMBC::Type::getTypeID(element_type);
    if (TVar3 == HalfTyID) {
      ptr_vec_type = spv::Builder::makeFloatType(this,0x20);
    }
    else {
      ptr_vec_type = spv::Builder::makeUintType(this,0x20);
    }
  }
  else {
    ptr_vec_type = Converter::Impl::get_type_id(impl,element_type,0);
  }
  if (vecsize < 2) {
    local_70 = ptr_vec_type;
  }
  else {
    local_70 = spv::Builder::makeVectorType(this,ptr_vec_type,vecsize);
  }
  IVar4 = spv::Builder::makePointer(this,StorageClassStorageBuffer,local_70);
  spv::Builder::addCapability(this,CapabilityRawAccessChainsNV);
  spv::Builder::addExtension(this,"SPV_NV_raw_access_chains");
  this_00 = Converter::Impl::allocate(impl,OpRawAccessChainNV,IVar4);
  pVVar7 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,1);
  IVar4 = Converter::Impl::get_id_for_value(impl,pVVar7,0);
  Operation::add_id(this_00,IVar4);
  iVar5 = spv::Builder::getScalarTypeWidth(this,ptr_vec_type);
  iVar5 = iVar5 / 8;
  if (meta->kind == RawBuffer) {
    uVar6 = raw_buffer_data_type_to_addr_shift_log2(impl,element_type);
    pVVar7 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,2);
    bVar2 = raw_access_byte_address_can_vectorize(impl,element_type,pVVar7,4);
    if (bVar2) {
      raw.component_type_id = 4;
    }
    else {
      pVVar7 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,2);
      bVar2 = raw_access_byte_address_can_vectorize(impl,element_type,pVVar7,2);
      if (bVar2) {
        raw.component_type_id = 2;
      }
      else {
        raw.component_type_id = 1;
      }
    }
    if (((raw.component_type_id == 1) || (0x10 < raw.component_type_id * iVar5)) ||
       (raw.component_type_id < vecsize)) {
      IVar4 = spv::Builder::makeUintConstant(this,0,false);
      Operation::add_id(this_00,IVar4);
      IVar4 = spv::Builder::makeUintConstant(this,0,false);
      Operation::add_id(this_00,IVar4);
      pVVar7 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,2);
      IVar4 = Converter::Impl::get_id_for_value(impl,pVVar7,0);
      Operation::add_id(this_00,IVar4);
      Operation::add_literal(this_00,1);
    }
    else {
      pVVar7 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,2);
      IVar4 = build_index_divider(impl,pVVar7,uVar6,raw.component_type_id);
      arg = spv::Builder::makeUintConstant(this,raw.component_type_id * iVar5,false);
      Operation::add_id(this_00,arg);
      Operation::add_id(this_00,IVar4);
      IVar4 = spv::Builder::makeUintConstant(this,0,false);
      Operation::add_id(this_00,IVar4);
      Operation::add_literal(this_00,2);
    }
  }
  else {
    IVar4 = spv::Builder::makeUintConstant(this,meta->stride,false);
    Operation::add_id(this_00,IVar4);
    pVVar7 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,2);
    IVar4 = Converter::Impl::get_id_for_value(impl,pVVar7,0);
    Operation::add_id(this_00,IVar4);
    pVVar7 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,3);
    IVar4 = Converter::Impl::get_id_for_value(impl,pVVar7,0);
    Operation::add_id(this_00,IVar4);
    Operation::add_literal(this_00,2);
    if ((meta->stride & iVar5 * 4 - 1U) == 0) {
      pVVar7 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,2);
      uVar6 = meta->stride;
      pVVar8 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,3);
      bVar2 = raw_access_structured_can_vectorize(impl,element_type,pVVar7,uVar6,pVVar8,4);
      if (bVar2) {
        raw.component_type_id = 4;
        goto LAB_0021bcd5;
      }
    }
    if ((meta->stride & iVar5 * 2 - 1U) == 0) {
      pVVar7 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,2);
      uVar6 = meta->stride;
      pVVar8 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,3);
      bVar2 = raw_access_structured_can_vectorize(impl,element_type,pVVar7,uVar6,pVVar8,2);
      if (bVar2) {
        raw.component_type_id = 2;
        goto LAB_0021bcd5;
      }
    }
    raw.component_type_id = 1;
  }
LAB_0021bcd5:
  raw.component_type_id = iVar5 * raw.component_type_id;
  impl_local._4_4_ = ptr_vec_type;
  raw.ptr_id = local_70;
  impl_local._0_4_ = this_00->id;
  Converter::Impl::add(impl,this_00,false);
  if ((meta->non_uniform & 1U) != 0) {
    spv::Builder::addDecoration(this,this_00->id,DecorationNonUniform,-1);
  }
  if (((meta->physical_pointer_meta).nonwritable & 1U) != 0) {
    spv::Builder::addDecoration(this,this_00->id,DecorationNonWritable,-1);
  }
  if (((meta->physical_pointer_meta).coherent & 1U) != 0) {
    spv::Builder::addDecoration(this,this_00->id,DecorationCoherent,-1);
  }
  RVar1.component_type_id = impl_local._4_4_;
  RVar1.ptr_id = (Id)impl_local;
  RVar1.vector_type_id = raw.ptr_id;
  RVar1.alignment = raw.component_type_id;
  return RVar1;
}

Assistant:

static RawAccessChain emit_raw_access_chain(Converter::Impl &impl, const Converter::Impl::ResourceMeta &meta,
                                            const llvm::CallInst *inst, const llvm::Type *element_type, unsigned vecsize)
{
	auto &builder = impl.builder();
	spv::Id raw_component_type_id;
	RawAccessChain raw = {};

	// If we're storing to min16 types and we use native 16-bit in arithmetic,
	// we have to expand to 32-bit before storing :(
	// This will probably fall over with int vs uint, since we don't know how to sign-extend.
	if (!impl.execution_mode_meta.native_16bit_operations &&
	    impl.options.min_precision_prefer_native_16bit &&
	    type_is_16bit(element_type))
	{
		if (element_type->getTypeID() == llvm::Type::TypeID::HalfTyID)
			raw_component_type_id = builder.makeFloatType(32);
		else
			raw_component_type_id = builder.makeUintType(32);
	}
	else
		raw_component_type_id = impl.get_type_id(element_type);

	spv::Id vec_type = vecsize > 1 ? builder.makeVectorType(raw_component_type_id, vecsize) : raw_component_type_id;
	spv::Id ptr_vec_type = builder.makePointer(spv::StorageClassStorageBuffer, vec_type);

	builder.addCapability(spv::CapabilityRawAccessChainsNV);
	builder.addExtension("SPV_NV_raw_access_chains");

	auto *op = impl.allocate(spv::OpRawAccessChainNV, ptr_vec_type);
	op->add_id(impl.get_id_for_value(inst->getOperand(1)));

	unsigned scalar_size = builder.getScalarTypeWidth(raw_component_type_id) / 8;

	if (meta.kind == DXIL::ResourceKind::RawBuffer)
	{
		unsigned addr_shift_log2 = raw_buffer_data_type_to_addr_shift_log2(impl, element_type);

		if (raw_access_byte_address_can_vectorize(impl, element_type, inst->getOperand(2), 4))
			raw.alignment = 4;
		else if (raw_access_byte_address_can_vectorize(impl, element_type, inst->getOperand(2), 2))
			raw.alignment = 2;
		else
			raw.alignment = 1;

		if (raw.alignment != 1 && raw.alignment * scalar_size <= 16 && vecsize <= raw.alignment)
		{
			// If we can prove vectorization, we can treat this as a structured buffer instead.
			// That way we needlessly avoid per-component robustness.
			// BAB descriptor range is aligned to 16 bytes, so we cannot use PerElementMask if the load
			// can straddle a 16 byte boundary.
			// If we care enough, we can split this load into two, and use per-element on both, but that's overkill.

			spv::Id element_id = build_index_divider(impl, inst->getOperand(2), addr_shift_log2, raw.alignment);
			op->add_id(builder.makeUintConstant(raw.alignment * scalar_size));
			op->add_id(element_id);
			op->add_id(builder.makeUintConstant(0));
			op->add_literal(spv::RawAccessChainOperandsRobustnessPerElementNVMask);
		}
		else
		{
			op->add_id(builder.makeUintConstant(0));
			op->add_id(builder.makeUintConstant(0));
			op->add_id(impl.get_id_for_value(inst->getOperand(2)));
			op->add_literal(spv::RawAccessChainOperandsRobustnessPerComponentNVMask);
		}
	}
	else
	{
		op->add_id(builder.makeUintConstant(meta.stride));
		op->add_id(impl.get_id_for_value(inst->getOperand(2)));
		op->add_id(impl.get_id_for_value(inst->getOperand(3)));
		op->add_literal(spv::RawAccessChainOperandsRobustnessPerElementNVMask);

		// Need extra check for stride alignment since we can normally "vectorize" vec3 structured buffers
		// if SSBO alignment is 4. However, we also need to make sure the alignment is correct before accepting.
		if ((meta.stride & (scalar_size * 4 - 1)) == 0 &&
		    raw_access_structured_can_vectorize(
			    impl, element_type,
			    inst->getOperand(2), meta.stride, inst->getOperand(3), 4))
		{
			raw.alignment = 4;
		}
		else if ((meta.stride & (scalar_size * 2 - 1)) == 0 &&
		         raw_access_structured_can_vectorize(
			         impl, element_type,
			         inst->getOperand(2), meta.stride,
			         inst->getOperand(3), 2))
		{
			raw.alignment = 2;
		}
		else
			raw.alignment = 1;
	}

	raw.alignment *= scalar_size;
	raw.component_type_id = raw_component_type_id;
	raw.vector_type_id = vec_type;
	raw.ptr_id = op->id;

	impl.add(op);

	if (meta.non_uniform)
		builder.addDecoration(op->id, spv::DecorationNonUniform);

	if (meta.physical_pointer_meta.nonwritable)
		builder.addDecoration(op->id, spv::DecorationNonWritable);
	if (meta.physical_pointer_meta.coherent)
		builder.addDecoration(op->id, spv::DecorationCoherent);

	return raw;
}